

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O0

VectorXd __thiscall mnf::operator-(mnf *this,Point *x,Point *y)

{
  Manifold *pMVar1;
  Index extraout_RDX;
  VectorXd VVar2;
  ConstRefVec local_a8;
  ConstRefVec local_80;
  RefVec local_48;
  Index local_30;
  undefined1 local_21;
  Point *local_20;
  Point *y_local;
  Point *x_local;
  VectorXd *output;
  
  local_21 = 0;
  local_20 = y;
  y_local = x;
  x_local = (Point *)this;
  pMVar1 = ConstSubPoint::getManifold(&(x->super_SubPoint).super_ConstSubPoint);
  local_30 = Manifold::dim(pMVar1);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,&local_30);
  pMVar1 = ConstSubPoint::getManifold(&(y_local->super_SubPoint).super_ConstSubPoint);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_48,
             (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,(type *)0x0);
  SubPoint::value(&local_80,&local_20->super_SubPoint);
  SubPoint::value(&local_a8,&y_local->super_SubPoint);
  Manifold::pseudoLog(pMVar1,&local_48,&local_80,&local_a8);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_a8);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_80);
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd operator-(const Point& x, const Point& y)
{
  Eigen::VectorXd output(x.getManifold().dim());
  x.getManifold().pseudoLog(output, y.value(), x.value());
  return output;
}